

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase887::run(TestCase887 *this)

{
  CapTableBuilder *pCVar1;
  WirePointer *pWVar2;
  CapTableBuilder *pCVar3;
  WirePointer *pWVar4;
  SegmentBuilder *pSVar5;
  int iVar6;
  SegmentBuilder *pSVar7;
  Reader value;
  Reader value_00;
  Reader value_01;
  Reader value_02;
  Reader value_03;
  Reader value_04;
  Reader value_05;
  Reader value_06;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar8;
  Builder sub;
  BuilderFor<capnproto_test::capnp::test::TestOldVersion> oldVersion;
  size_t size5;
  size_t size6;
  size_t size4;
  size_t size2;
  size_t size;
  Builder root;
  MallocMessageBuilder builder;
  PointerBuilder local_1f0;
  StructBuilder local_1d8;
  Builder local_1b0;
  StructBuilder local_198;
  SegmentBuilder *local_168;
  SegmentBuilder *local_160;
  SegmentBuilder *local_158;
  SegmentBuilder *local_150;
  size_t local_148;
  StructBuilder local_140;
  MallocMessageBuilder local_118;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_118,0,FIXED_SIZE);
  MessageBuilder::getRootInternal((Builder *)&local_1d8,&local_118.super_MessageBuilder);
  local_198.data = local_1d8.data;
  local_198.segment = local_1d8.segment;
  local_198.capTable = local_1d8.capTable;
  PointerBuilder::initStruct(&local_140,(PointerBuilder *)&local_198,(StructSize)0x10000);
  AVar8 = MessageBuilder::getSegmentsForOutput(&local_118.super_MessageBuilder);
  local_148 = AVar8.size_;
  if ((local_148 != 2) && (kj::_::Debug::minSeverity < 3)) {
    local_198.segment = (SegmentBuilder *)CONCAT44(local_198.segment._4_4_,2);
    kj::_::Debug::log<char_const(&)[32],unsigned_int,unsigned_long&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x381,ERROR,"\"failed: expected \" \"(2u) == (size)\", 2u, size",
               (char (*) [32])"failed: expected (2u) == (size)",(uint *)&local_198,&local_148);
  }
  local_1d8.segment = local_140.segment;
  local_1d8.capTable = local_140.capTable;
  local_1d8.data = local_140.pointers;
  PointerBuilder::initStruct(&local_198,(PointerBuilder *)&local_1d8,(StructSize)0x20001);
  *(long *)local_198.data = 0x7b;
  local_1d8.segment = local_198.segment;
  local_1d8.capTable = local_198.capTable;
  local_1d8.data = local_198.pointers;
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_1d8,value);
  local_1f0.pointer = local_198.pointers + 1;
  local_1f0.segment = local_198.segment;
  local_1f0.capTable = local_198.capTable;
  PointerBuilder::initStruct(&local_1d8,&local_1f0,(StructSize)0x20001);
  *(WirePointer *)local_1d8.data = (WirePointer)0x1c8;
  local_1f0.segment = local_1d8.segment;
  local_1f0.capTable = local_1d8.capTable;
  local_1f0.pointer = local_1d8.pointers;
  value_00.super_StringPtr.content.size_ = 4;
  value_00.super_StringPtr.content.ptr = "bar";
  PointerBuilder::setBlob<capnp::Text>(&local_1f0,value_00);
  AVar8 = MessageBuilder::getSegmentsForOutput(&local_118.super_MessageBuilder);
  local_150 = (SegmentBuilder *)AVar8.size_;
  if (((SegmentBuilder *)(local_148 + 4) != local_150) && (kj::_::Debug::minSeverity < 3)) {
    local_198.segment = (SegmentBuilder *)(local_148 + 4);
    kj::_::Debug::log<char_const(&)[39],unsigned_long,unsigned_long&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x38e,ERROR,"\"failed: expected \" \"(size + 4) == (size2)\", size + 4, size2",
               (char (*) [39])"failed: expected (size + 4) == (size2)",(unsigned_long *)&local_198,
               (unsigned_long *)&local_150);
  }
  local_1d8.segment = local_140.segment;
  local_1d8.capTable = local_140.capTable;
  local_1d8.data = local_140.pointers;
  PointerBuilder::getStruct(&local_198,(PointerBuilder *)&local_1d8,(StructSize)0x30002,(word *)0x0)
  ;
  AVar8 = MessageBuilder::getSegmentsForOutput(&local_118.super_MessageBuilder);
  local_168 = (SegmentBuilder *)AVar8.size_;
  pSVar7 = (SegmentBuilder *)((long)&(local_150->super_SegmentReader).arena + 1);
  if ((pSVar7 != local_168) && (kj::_::Debug::minSeverity < 3)) {
    local_1d8.segment = pSVar7;
    kj::_::Debug::log<char_const(&)[40],unsigned_long,unsigned_long&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x397,ERROR,"\"failed: expected \" \"(size2 + 1) == (size3)\", size2 + 1, size3",
               (char (*) [40])"failed: expected (size2 + 1) == (size3)",(unsigned_long *)&local_1d8,
               (unsigned_long *)&local_168);
  }
  local_1f0.pointer = local_198.pointers + 1;
  local_1f0.segment = local_198.segment;
  local_1f0.capTable = local_198.capTable;
  PointerBuilder::getStruct(&local_1d8,&local_1f0,(StructSize)0x30002,(word *)0x0);
  AVar8 = MessageBuilder::getSegmentsForOutput(&local_118.super_MessageBuilder);
  local_158 = (SegmentBuilder *)AVar8.size_;
  local_1f0.segment = (SegmentBuilder *)((long)&(local_168->super_SegmentReader).arena + 1);
  if ((local_1f0.segment != local_158) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[40],unsigned_long,unsigned_long&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x39d,ERROR,"\"failed: expected \" \"(size3 + 1) == (size4)\", size3 + 1, size4",
               (char (*) [40])"failed: expected (size3 + 1) == (size4)",(unsigned_long *)&local_1f0,
               (unsigned_long *)&local_158);
  }
  if ((*local_198.data != 0x7b) && (kj::_::Debug::minSeverity < 3)) {
    local_1b0._0_4_ = 0x7b;
    local_1f0.segment = *local_198.data;
    kj::_::Debug::log<char_const(&)[49],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3a0,ERROR,
               "\"failed: expected \" \"(123) == (newVersion.getOld1())\", 123, newVersion.getOld1()"
               ,(char (*) [49])"failed: expected (123) == (newVersion.getOld1())",(int *)&local_1b0,
               (long *)&local_1f0);
  }
  local_1f0.segment = local_198.segment;
  local_1f0.capTable = local_198.capTable;
  local_1f0.pointer = local_198.pointers;
  PointerBuilder::getBlob<capnp::Text>(&local_1b0,&local_1f0,(void *)0x0,0);
  pCVar1 = local_1f0.capTable;
  pWVar2 = local_1f0.pointer;
  pSVar7 = local_198.segment;
  pCVar3 = local_198.capTable;
  pWVar4 = local_198.pointers;
  if (((local_1b0.content.size_ != 4) ||
      (iVar6 = bcmp(local_1b0.content.ptr,"foo",3), pCVar1 = local_1f0.capTable,
      pWVar2 = local_1f0.pointer, pSVar7 = local_198.segment, pCVar3 = local_198.capTable,
      pWVar4 = local_198.pointers, iVar6 != 0)) &&
     (local_1f0.pointer = pWVar4, local_1f0.capTable = pCVar3, local_1f0.segment = pSVar7,
     local_198.segment = local_1f0.segment, local_198.capTable = local_1f0.capTable,
     local_198.pointers = local_1f0.pointer, kj::_::Debug::minSeverity < 3)) {
    PointerBuilder::getBlob<capnp::Text>(&local_1b0,&local_1f0,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[51],char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3a1,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (newVersion.getOld2())\", \"foo\", newVersion.getOld2()"
               ,(char (*) [51])"failed: expected (\"foo\") == (newVersion.getOld2())",
               (char (*) [4])"foo",&local_1b0);
    pCVar1 = local_1f0.capTable;
    pWVar2 = local_1f0.pointer;
  }
  local_1f0.pointer = pWVar2;
  local_1f0.capTable = pCVar1;
  if ((*(ulong *)((long)local_198.data + 8) != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_1f0.segment = (SegmentBuilder *)(*(ulong *)((long)local_198.data + 8) ^ 0x3db);
    local_1b0._0_4_ = 0x3db;
    kj::_::Debug::log<char_const(&)[49],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3a2,ERROR,
               "\"failed: expected \" \"(987) == (newVersion.getNew1())\", 987, newVersion.getNew1()"
               ,(char (*) [49])"failed: expected (987) == (newVersion.getNew1())",(int *)&local_1b0,
               (long *)&local_1f0);
  }
  local_1f0.pointer = local_198.pointers + 2;
  local_1f0.segment = local_198.segment;
  local_1f0.capTable = local_198.capTable;
  PointerBuilder::getBlob<capnp::Text>(&local_1b0,&local_1f0,&DAT_002f97e8,3);
  pCVar1 = local_1f0.capTable;
  pSVar7 = local_198.segment;
  pCVar3 = local_198.capTable;
  if (((local_1b0.content.size_ != 4) ||
      (iVar6 = bcmp(local_1b0.content.ptr,"baz",3), pCVar1 = local_1f0.capTable,
      pSVar7 = local_198.segment, pCVar3 = local_198.capTable, iVar6 != 0)) &&
     (local_1f0.capTable = pCVar3, local_1f0.segment = pSVar7, local_198.segment = local_1f0.segment
     , local_198.capTable = local_1f0.capTable, kj::_::Debug::minSeverity < 3)) {
    local_1f0.pointer = local_198.pointers + 2;
    PointerBuilder::getBlob<capnp::Text>(&local_1b0,&local_1f0,&DAT_002f97e8,3);
    kj::_::Debug::log<char_const(&)[51],char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3a3,ERROR,
               "\"failed: expected \" \"(\\\"baz\\\") == (newVersion.getNew2())\", \"baz\", newVersion.getNew2()"
               ,(char (*) [51])"failed: expected (\"baz\") == (newVersion.getNew2())",
               (char (*) [4])0x2c5c46,&local_1b0);
    pCVar1 = local_1f0.capTable;
  }
  local_1f0.capTable = pCVar1;
  if ((*local_1d8.data != (WirePointer)0x1c8) && (kj::_::Debug::minSeverity < 3)) {
    local_1b0._0_4_ = 0x1c8;
    local_1f0.segment = *local_1d8.data;
    kj::_::Debug::log<char_const(&)[42],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3a5,ERROR,"\"failed: expected \" \"(456) == (sub.getOld1())\", 456, sub.getOld1()"
               ,(char (*) [42])"failed: expected (456) == (sub.getOld1())",(int *)&local_1b0,
               (long *)&local_1f0);
  }
  local_1f0.segment = local_1d8.segment;
  local_1f0.capTable = local_1d8.capTable;
  local_1f0.pointer = local_1d8.pointers;
  PointerBuilder::getBlob<capnp::Text>(&local_1b0,&local_1f0,(void *)0x0,0);
  pCVar1 = local_1f0.capTable;
  pWVar2 = local_1f0.pointer;
  pSVar7 = local_1d8.segment;
  pCVar3 = local_1d8.capTable;
  pWVar4 = local_1d8.pointers;
  if (((local_1b0.content.size_ != 4) ||
      (iVar6 = bcmp(local_1b0.content.ptr,"bar",3), pCVar1 = local_1f0.capTable,
      pWVar2 = local_1f0.pointer, pSVar7 = local_1d8.segment, pCVar3 = local_1d8.capTable,
      pWVar4 = local_1d8.pointers, iVar6 != 0)) &&
     (local_1f0.pointer = pWVar4, local_1f0.capTable = pCVar3, local_1f0.segment = pSVar7,
     local_1d8.segment = local_1f0.segment, local_1d8.capTable = local_1f0.capTable,
     local_1d8.pointers = local_1f0.pointer, kj::_::Debug::minSeverity < 3)) {
    PointerBuilder::getBlob<capnp::Text>(&local_1b0,&local_1f0,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[44],char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3a6,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (sub.getOld2())\", \"bar\", sub.getOld2()",
               (char (*) [44])"failed: expected (\"bar\") == (sub.getOld2())",(char (*) [4])0x2be72e
               ,&local_1b0);
    pCVar1 = local_1f0.capTable;
    pWVar2 = local_1f0.pointer;
  }
  local_1f0.pointer = pWVar2;
  local_1f0.capTable = pCVar1;
  if ((*(WirePointer *)((long)local_1d8.data + 8) != (WirePointer)0x0) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_1f0.segment =
         (SegmentBuilder *)((ulong)*(WirePointer *)((long)local_1d8.data + 8) ^ 0x3db);
    local_1b0._0_4_ = 0x3db;
    kj::_::Debug::log<char_const(&)[42],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3a7,ERROR,"\"failed: expected \" \"(987) == (sub.getNew1())\", 987, sub.getNew1()"
               ,(char (*) [42])"failed: expected (987) == (sub.getNew1())",(int *)&local_1b0,
               (long *)&local_1f0);
  }
  local_1f0.pointer = local_1d8.pointers + 2;
  local_1f0.segment = local_1d8.segment;
  local_1f0.capTable = local_1d8.capTable;
  PointerBuilder::getBlob<capnp::Text>(&local_1b0,&local_1f0,&DAT_002f97e8,3);
  pSVar7 = local_1d8.segment;
  pCVar1 = local_1d8.capTable;
  if (((local_1b0.content.size_ != 4) ||
      (iVar6 = bcmp(local_1b0.content.ptr,"baz",3), pSVar7 = local_1d8.segment,
      pCVar1 = local_1d8.capTable, iVar6 != 0)) &&
     (local_1f0.capTable = pCVar1, local_1f0.segment = pSVar7, local_1d8.segment = local_1f0.segment
     , local_1d8.capTable = local_1f0.capTable, kj::_::Debug::minSeverity < 3)) {
    local_1f0.pointer = local_1d8.pointers + 2;
    PointerBuilder::getBlob<capnp::Text>(&local_1b0,&local_1f0,&DAT_002f97e8,3);
    kj::_::Debug::log<char_const(&)[44],char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3a8,ERROR,
               "\"failed: expected \" \"(\\\"baz\\\") == (sub.getNew2())\", \"baz\", sub.getNew2()",
               (char (*) [44])"failed: expected (\"baz\") == (sub.getNew2())",(char (*) [4])0x2c5c46
               ,&local_1b0);
  }
  *(long *)local_198.data = 0xea;
  local_1f0.segment = local_198.segment;
  local_1f0.capTable = local_198.capTable;
  local_1f0.pointer = local_198.pointers;
  value_01.super_StringPtr.content.size_ = 4;
  value_01.super_StringPtr.content.ptr = "qux";
  PointerBuilder::setBlob<capnp::Text>(&local_1f0,value_01);
  *(long *)((long)local_198.data + 8) = 0x29a;
  local_1f0.pointer = local_198.pointers + 2;
  local_1f0.segment = local_198.segment;
  local_1f0.capTable = local_198.capTable;
  value_02.super_StringPtr.content.size_ = 5;
  value_02.super_StringPtr.content.ptr = "quux";
  PointerBuilder::setBlob<capnp::Text>(&local_1f0,value_02);
  *(WirePointer *)local_1d8.data = (WirePointer)0x237;
  local_1f0.segment = local_1d8.segment;
  local_1f0.capTable = local_1d8.capTable;
  local_1f0.pointer = local_1d8.pointers;
  value_03.super_StringPtr.content.size_ = 6;
  value_03.super_StringPtr.content.ptr = "corge";
  PointerBuilder::setBlob<capnp::Text>(&local_1f0,value_03);
  ((WirePointer *)((long)local_1d8.data + 8))->offsetAndKind = 0x155;
  ((WirePointer *)((long)local_1d8.data + 8))->field_1 =
       (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  local_1f0.pointer = local_1d8.pointers + 2;
  local_1f0.segment = local_1d8.segment;
  local_1f0.capTable = local_1d8.capTable;
  value_04.super_StringPtr.content.size_ = 7;
  value_04.super_StringPtr.content.ptr = "grault";
  PointerBuilder::setBlob<capnp::Text>(&local_1f0,value_04);
  AVar8 = MessageBuilder::getSegmentsForOutput(&local_118.super_MessageBuilder);
  local_168 = (SegmentBuilder *)AVar8.size_;
  pSVar7 = (SegmentBuilder *)((long)&(local_158->super_SegmentReader).arena + 6);
  if ((pSVar7 != local_168) && (kj::_::Debug::minSeverity < 3)) {
    local_198.segment = pSVar7;
    kj::_::Debug::log<char_const(&)[40],unsigned_long,unsigned_long&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3b7,ERROR,"\"failed: expected \" \"(size4 + 6) == (size5)\", size4 + 6, size5",
               (char (*) [40])"failed: expected (size4 + 6) == (size5)",(unsigned_long *)&local_198,
               (unsigned_long *)&local_168);
  }
  local_1d8.segment = local_140.segment;
  local_1d8.capTable = local_140.capTable;
  local_1d8.data = local_140.pointers;
  PointerBuilder::getStruct(&local_198,(PointerBuilder *)&local_1d8,(StructSize)0x20001,(word *)0x0)
  ;
  if ((*local_198.data != 0xea) && (kj::_::Debug::minSeverity < 3)) {
    local_1f0.segment = (SegmentBuilder *)CONCAT44(local_1f0.segment._4_4_,0xea);
    local_1d8.segment = *local_198.data;
    kj::_::Debug::log<char_const(&)[49],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3bc,ERROR,
               "\"failed: expected \" \"(234) == (oldVersion.getOld1())\", 234, oldVersion.getOld1()"
               ,(char (*) [49])"failed: expected (234) == (oldVersion.getOld1())",(int *)&local_1f0,
               (long *)&local_1d8);
  }
  local_1d8.segment = local_198.segment;
  local_1d8.capTable = local_198.capTable;
  local_1d8.data = local_198.pointers;
  PointerBuilder::getBlob<capnp::Text>
            ((Builder *)&local_1f0,(PointerBuilder *)&local_1d8,(void *)0x0,0);
  pSVar7 = local_1d8.segment;
  pCVar1 = local_1d8.capTable;
  pWVar2 = (WirePointer *)local_1d8.data;
  pSVar5 = local_198.segment;
  pCVar3 = local_198.capTable;
  pWVar4 = local_198.pointers;
  if (((local_1f0.pointer != (WirePointer *)0x4) ||
      (iVar6 = bcmp(local_1f0.capTable,"qux",3), pSVar7 = local_1d8.segment,
      pCVar1 = local_1d8.capTable, pWVar2 = (WirePointer *)local_1d8.data,
      pSVar5 = local_198.segment, pCVar3 = local_198.capTable, pWVar4 = local_198.pointers,
      iVar6 != 0)) &&
     (local_1d8.data = pWVar4, local_1d8.capTable = pCVar3, local_1d8.segment = pSVar5,
     local_198.segment = local_1d8.segment, local_198.capTable = local_1d8.capTable,
     local_198.pointers = (WirePointer *)local_1d8.data, kj::_::Debug::minSeverity < 3)) {
    PointerBuilder::getBlob<capnp::Text>
              ((Builder *)&local_1f0,(PointerBuilder *)&local_1d8,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[51],char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3bd,ERROR,
               "\"failed: expected \" \"(\\\"qux\\\") == (oldVersion.getOld2())\", \"qux\", oldVersion.getOld2()"
               ,(char (*) [51])"failed: expected (\"qux\") == (oldVersion.getOld2())",
               (char (*) [4])0x2cb625,(Builder *)&local_1f0);
    pSVar7 = local_1d8.segment;
    pCVar1 = local_1d8.capTable;
    pWVar2 = (WirePointer *)local_1d8.data;
  }
  local_1d8.data = pWVar2;
  local_1d8.capTable = pCVar1;
  local_1d8.segment = pSVar7;
  local_1f0.pointer = local_198.pointers + 1;
  local_1f0.segment = local_198.segment;
  local_1f0.capTable = local_198.capTable;
  PointerBuilder::getStruct(&local_1d8,&local_1f0,(StructSize)0x20001,(word *)0x0);
  if ((*local_1d8.data != (WirePointer)0x237) && (kj::_::Debug::minSeverity < 3)) {
    local_1b0._0_4_ = 0x237;
    local_1f0.segment = *local_1d8.data;
    kj::_::Debug::log<char_const(&)[42],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3c0,ERROR,"\"failed: expected \" \"(567) == (sub.getOld1())\", 567, sub.getOld1()"
               ,(char (*) [42])"failed: expected (567) == (sub.getOld1())",(int *)&local_1b0,
               (long *)&local_1f0);
  }
  local_1f0.segment = local_1d8.segment;
  local_1f0.capTable = local_1d8.capTable;
  local_1f0.pointer = local_1d8.pointers;
  PointerBuilder::getBlob<capnp::Text>(&local_1b0,&local_1f0,(void *)0x0,0);
  pSVar7 = local_1d8.segment;
  pCVar1 = local_1d8.capTable;
  if (((local_1b0.content.size_ != 6) ||
      (iVar6 = bcmp(local_1b0.content.ptr,"corge",5), pSVar7 = local_1d8.segment,
      pCVar1 = local_1d8.capTable, iVar6 != 0)) &&
     (local_1f0.capTable = pCVar1, local_1f0.segment = pSVar7, local_1d8.segment = local_1f0.segment
     , local_1d8.capTable = local_1f0.capTable, kj::_::Debug::minSeverity < 3)) {
    PointerBuilder::getBlob<capnp::Text>(&local_1b0,&local_1f0,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[46],char_const(&)[6],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3c1,ERROR,
               "\"failed: expected \" \"(\\\"corge\\\") == (sub.getOld2())\", \"corge\", sub.getOld2()"
               ,(char (*) [46])"failed: expected (\"corge\") == (sub.getOld2())",
               (char (*) [6])"corge",&local_1b0);
  }
  *(long *)local_198.data = 0x159;
  local_1f0.segment = local_198.segment;
  local_1f0.capTable = local_198.capTable;
  local_1f0.pointer = local_198.pointers;
  value_05.super_StringPtr.content.size_ = 7;
  value_05.super_StringPtr.content.ptr = "garply";
  PointerBuilder::setBlob<capnp::Text>(&local_1f0,value_05);
  *(WirePointer *)local_1d8.data = (WirePointer)0x2a6;
  local_1f0.segment = local_1d8.segment;
  local_1f0.capTable = local_1d8.capTable;
  local_1f0.pointer = local_1d8.pointers;
  value_06.super_StringPtr.content.size_ = 6;
  value_06.super_StringPtr.content.ptr = anon_var_dwarf_8676b;
  PointerBuilder::setBlob<capnp::Text>(&local_1f0,value_06);
  AVar8 = MessageBuilder::getSegmentsForOutput(&local_118.super_MessageBuilder);
  local_160 = (SegmentBuilder *)AVar8.size_;
  pSVar7 = (SegmentBuilder *)((long)&(local_168->super_SegmentReader).arena + 2);
  if ((pSVar7 != local_160) && (kj::_::Debug::minSeverity < 3)) {
    local_198.segment = pSVar7;
    kj::_::Debug::log<char_const(&)[40],unsigned_long,unsigned_long&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3cc,ERROR,"\"failed: expected \" \"(size5 + 2) == (size6)\", size5 + 2, size6",
               (char (*) [40])"failed: expected (size5 + 2) == (size6)",(unsigned_long *)&local_198,
               (unsigned_long *)&local_160);
  }
  local_1d8.segment = local_140.segment;
  local_1d8.capTable = local_140.capTable;
  local_1d8.data = local_140.pointers;
  PointerBuilder::getStruct(&local_198,(PointerBuilder *)&local_1d8,(StructSize)0x30002,(word *)0x0)
  ;
  if ((*local_198.data != 0x159) && (kj::_::Debug::minSeverity < 3)) {
    local_1f0.segment = (SegmentBuilder *)CONCAT44(local_1f0.segment._4_4_,0x159);
    local_1d8.segment = *local_198.data;
    kj::_::Debug::log<char_const(&)[49],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3d1,ERROR,
               "\"failed: expected \" \"(345) == (newVersion.getOld1())\", 345, newVersion.getOld1()"
               ,(char (*) [49])"failed: expected (345) == (newVersion.getOld1())",(int *)&local_1f0,
               (long *)&local_1d8);
  }
  local_1d8.segment = local_198.segment;
  local_1d8.capTable = local_198.capTable;
  local_1d8.data = local_198.pointers;
  PointerBuilder::getBlob<capnp::Text>
            ((Builder *)&local_1f0,(PointerBuilder *)&local_1d8,(void *)0x0,0);
  pCVar1 = local_1d8.capTable;
  pWVar2 = (WirePointer *)local_1d8.data;
  pSVar7 = local_198.segment;
  pCVar3 = local_198.capTable;
  pWVar4 = local_198.pointers;
  if (((local_1f0.pointer != (WirePointer *)0x7) ||
      (iVar6 = bcmp(local_1f0.capTable,"garply",6), pCVar1 = local_1d8.capTable,
      pWVar2 = (WirePointer *)local_1d8.data, pSVar7 = local_198.segment,
      pCVar3 = local_198.capTable, pWVar4 = local_198.pointers, iVar6 != 0)) &&
     (local_1d8.data = pWVar4, local_1d8.capTable = pCVar3, local_1d8.segment = pSVar7,
     local_198.segment = local_1d8.segment, local_198.capTable = local_1d8.capTable,
     local_198.pointers = (WirePointer *)local_1d8.data, kj::_::Debug::minSeverity < 3)) {
    PointerBuilder::getBlob<capnp::Text>
              ((Builder *)&local_1f0,(PointerBuilder *)&local_1d8,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[54],char_const(&)[7],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3d2,ERROR,
               "\"failed: expected \" \"(\\\"garply\\\") == (newVersion.getOld2())\", \"garply\", newVersion.getOld2()"
               ,(char (*) [54])"failed: expected (\"garply\") == (newVersion.getOld2())",
               (char (*) [7])"garply",(Builder *)&local_1f0);
    pCVar1 = local_1d8.capTable;
    pWVar2 = (WirePointer *)local_1d8.data;
  }
  local_1d8.data = pWVar2;
  local_1d8.capTable = pCVar1;
  if ((*(ulong *)((long)local_198.data + 8) != 0x29a) && (kj::_::Debug::minSeverity < 3)) {
    local_1d8.segment = (SegmentBuilder *)(*(ulong *)((long)local_198.data + 8) ^ 0x3db);
    local_1f0.segment = (SegmentBuilder *)CONCAT44(local_1f0.segment._4_4_,0x141);
    kj::_::Debug::log<char_const(&)[49],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3d3,ERROR,
               "\"failed: expected \" \"(321) == (newVersion.getNew1())\", 321, newVersion.getNew1()"
               ,(char (*) [49])"failed: expected (321) == (newVersion.getNew1())",(int *)&local_1f0,
               (long *)&local_1d8);
  }
  local_1d8.data = local_198.pointers + 2;
  local_1d8.segment = local_198.segment;
  local_1d8.capTable = local_198.capTable;
  PointerBuilder::getBlob<capnp::Text>
            ((Builder *)&local_1f0,(PointerBuilder *)&local_1d8,&DAT_002f97e8,3);
  pSVar7 = local_1d8.segment;
  pCVar1 = local_1d8.capTable;
  pSVar5 = local_198.segment;
  pCVar3 = local_198.capTable;
  if (((local_1f0.pointer != (WirePointer *)0x5) ||
      (iVar6 = bcmp(local_1f0.capTable,"quux",4), pSVar7 = local_1d8.segment,
      pCVar1 = local_1d8.capTable, pSVar5 = local_198.segment, pCVar3 = local_198.capTable,
      iVar6 != 0)) &&
     (local_1d8.capTable = pCVar3, local_1d8.segment = pSVar5, local_198.segment = local_1d8.segment
     , local_198.capTable = local_1d8.capTable, kj::_::Debug::minSeverity < 3)) {
    local_1d8.data = local_198.pointers + 2;
    PointerBuilder::getBlob<capnp::Text>
              ((Builder *)&local_1f0,(PointerBuilder *)&local_1d8,&DAT_002f97e8,3);
    kj::_::Debug::log<char_const(&)[52],char_const(&)[5],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3d4,ERROR,
               "\"failed: expected \" \"(\\\"quux\\\") == (newVersion.getNew2())\", \"quux\", newVersion.getNew2()"
               ,(char (*) [52])"failed: expected (\"quux\") == (newVersion.getNew2())",
               (char (*) [5])0x2cb62c,(Builder *)&local_1f0);
    pSVar7 = local_1d8.segment;
    pCVar1 = local_1d8.capTable;
  }
  local_1d8.capTable = pCVar1;
  local_1d8.segment = pSVar7;
  local_1f0.pointer = local_198.pointers + 1;
  local_1f0.segment = local_198.segment;
  local_1f0.capTable = local_198.capTable;
  PointerBuilder::getStruct(&local_1d8,&local_1f0,(StructSize)0x30002,(word *)0x0);
  if ((*local_1d8.data != (WirePointer)0x2a6) && (kj::_::Debug::minSeverity < 3)) {
    local_1b0._0_4_ = 0x2a6;
    local_1f0.segment = *local_1d8.data;
    kj::_::Debug::log<char_const(&)[42],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3d7,ERROR,"\"failed: expected \" \"(678) == (sub.getOld1())\", 678, sub.getOld1()"
               ,(char (*) [42])"failed: expected (678) == (sub.getOld1())",(int *)&local_1b0,
               (long *)&local_1f0);
  }
  local_1f0.segment = local_1d8.segment;
  local_1f0.capTable = local_1d8.capTable;
  local_1f0.pointer = local_1d8.pointers;
  PointerBuilder::getBlob<capnp::Text>(&local_1b0,&local_1f0,(void *)0x0,0);
  pCVar1 = local_1f0.capTable;
  pWVar2 = local_1f0.pointer;
  pSVar7 = local_1d8.segment;
  pCVar3 = local_1d8.capTable;
  pWVar4 = local_1d8.pointers;
  if (((local_1b0.content.size_ != 6) ||
      (iVar6 = bcmp(local_1b0.content.ptr,anon_var_dwarf_8676b,5), pCVar1 = local_1f0.capTable,
      pWVar2 = local_1f0.pointer, pSVar7 = local_1d8.segment, pCVar3 = local_1d8.capTable,
      pWVar4 = local_1d8.pointers, iVar6 != 0)) &&
     (local_1f0.pointer = pWVar4, local_1f0.capTable = pCVar3, local_1f0.segment = pSVar7,
     local_1d8.segment = local_1f0.segment, local_1d8.capTable = local_1f0.capTable,
     local_1d8.pointers = local_1f0.pointer, kj::_::Debug::minSeverity < 3)) {
    PointerBuilder::getBlob<capnp::Text>(&local_1b0,&local_1f0,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[46],char_const(&)[6],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3d8,ERROR,
               "\"failed: expected \" \"(\\\"waldo\\\") == (sub.getOld2())\", \"waldo\", sub.getOld2()"
               ,(char (*) [46])"failed: expected (\"waldo\") == (sub.getOld2())",
               &anon_var_dwarf_8676b,&local_1b0);
    pCVar1 = local_1f0.capTable;
    pWVar2 = local_1f0.pointer;
  }
  local_1f0.pointer = pWVar2;
  local_1f0.capTable = pCVar1;
  if ((*(WirePointer *)((long)local_1d8.data + 8) != (WirePointer)0x155) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_1f0.segment =
         (SegmentBuilder *)((ulong)*(WirePointer *)((long)local_1d8.data + 8) ^ 0x3db);
    local_1b0._0_4_ = 0x28e;
    kj::_::Debug::log<char_const(&)[42],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3d9,ERROR,"\"failed: expected \" \"(654) == (sub.getNew1())\", 654, sub.getNew1()"
               ,(char (*) [42])"failed: expected (654) == (sub.getNew1())",(int *)&local_1b0,
               (long *)&local_1f0);
  }
  local_1f0.pointer = local_1d8.pointers + 2;
  local_1f0.segment = local_1d8.segment;
  local_1f0.capTable = local_1d8.capTable;
  PointerBuilder::getBlob<capnp::Text>(&local_1b0,&local_1f0,&DAT_002f97e8,3);
  pSVar7 = local_1f0.segment;
  pCVar1 = local_1f0.capTable;
  pSVar5 = local_1d8.segment;
  pCVar3 = local_1d8.capTable;
  if (((local_1b0.content.size_ != 7) ||
      (iVar6 = bcmp(local_1b0.content.ptr,"grault",6), pSVar7 = local_1f0.segment,
      pCVar1 = local_1f0.capTable, pSVar5 = local_1d8.segment, pCVar3 = local_1d8.capTable,
      iVar6 != 0)) &&
     (local_1f0.capTable = pCVar3, local_1f0.segment = pSVar5, local_1d8.segment = local_1f0.segment
     , local_1d8.capTable = local_1f0.capTable, kj::_::Debug::minSeverity < 3)) {
    local_1f0.pointer = local_1d8.pointers + 2;
    PointerBuilder::getBlob<capnp::Text>(&local_1b0,&local_1f0,&DAT_002f97e8,3);
    kj::_::Debug::log<char_const(&)[47],char_const(&)[7],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3da,ERROR,
               "\"failed: expected \" \"(\\\"grault\\\") == (sub.getNew2())\", \"grault\", sub.getNew2()"
               ,(char (*) [47])"failed: expected (\"grault\") == (sub.getNew2())",
               (char (*) [7])"grault",&local_1b0);
    pSVar7 = local_1f0.segment;
    pCVar1 = local_1f0.capTable;
  }
  local_1f0.capTable = pCVar1;
  local_1f0.segment = pSVar7;
  pSVar7 = local_160;
  AVar8 = MessageBuilder::getSegmentsForOutput(&local_118.super_MessageBuilder);
  if ((pSVar7 != (SegmentBuilder *)AVar8.size_) && (kj::_::Debug::minSeverity < 3)) {
    AVar8 = MessageBuilder::getSegmentsForOutput(&local_118.super_MessageBuilder);
    local_198.segment = (SegmentBuilder *)AVar8.size_;
    kj::_::Debug::log<char_const(&)[68],unsigned_long&,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x3df,ERROR,
               "\"failed: expected \" \"(size6) == (builder.getSegmentsForOutput().size())\", size6, builder.getSegmentsForOutput().size()"
               ,(char (*) [68])"failed: expected (size6) == (builder.getSegmentsForOutput().size())"
               ,(unsigned_long *)&local_160,(unsigned_long *)&local_198);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_118);
  return;
}

Assistant:

TEST(Encoding, UpgradeStructInBuilderMultiSegment) {
  // Exactly like the previous test, except that we force multiple segments.  Since we force a
  // separate segment for every object, every pointer is a far pointer, and far pointers are easily
  // transferred, so this is actually not such a complicated case.

  MallocMessageBuilder builder(0, AllocationStrategy::FIXED_SIZE);
  auto root = builder.initRoot<test::TestAnyPointer>();

  // Start with a 1-word first segment and the root object in the second segment.
  size_t size = builder.getSegmentsForOutput().size();
  EXPECT_EQ(2u, size);

  {
    auto oldVersion = root.getAnyPointerField().initAs<test::TestOldVersion>();
    oldVersion.setOld1(123);
    oldVersion.setOld2("foo");
    auto sub = oldVersion.initOld3();
    sub.setOld1(456);
    sub.setOld2("bar");
  }

  // Allocated two structs and two strings.
  size_t size2 = builder.getSegmentsForOutput().size();
  EXPECT_EQ(size + 4, size2);

  size_t size4;

  {
    auto newVersion = root.getAnyPointerField().getAs<test::TestNewVersion>();

    // Allocated a new struct.
    size_t size3 = builder.getSegmentsForOutput().size();
    EXPECT_EQ(size2 + 1, size3);

    auto sub = newVersion.getOld3();

    // Allocated another new struct for its string field.
    size4 = builder.getSegmentsForOutput().size();
    EXPECT_EQ(size3 + 1, size4);

    // Check contents.
    EXPECT_EQ(123, newVersion.getOld1());
    EXPECT_EQ("foo", newVersion.getOld2());
    EXPECT_EQ(987, newVersion.getNew1());
    EXPECT_EQ("baz", newVersion.getNew2());

    EXPECT_EQ(456, sub.getOld1());
    EXPECT_EQ("bar", sub.getOld2());
    EXPECT_EQ(987, sub.getNew1());
    EXPECT_EQ("baz", sub.getNew2());

    newVersion.setOld1(234);
    newVersion.setOld2("qux");
    newVersion.setNew1(321);
    newVersion.setNew2("quux");

    sub.setOld1(567);
    sub.setOld2("corge");
    sub.setNew1(654);
    sub.setNew2("grault");
  }

  // Set four strings and implicitly initialized two.
  size_t size5 = builder.getSegmentsForOutput().size();
  EXPECT_EQ(size4 + 6, size5);

  {
    // Go back to old version.  It should have the values set on the new version.
    auto oldVersion = root.getAnyPointerField().getAs<test::TestOldVersion>();
    EXPECT_EQ(234, oldVersion.getOld1());
    EXPECT_EQ("qux", oldVersion.getOld2());

    auto sub = oldVersion.getOld3();
    EXPECT_EQ(567, sub.getOld1());
    EXPECT_EQ("corge", sub.getOld2());

    // Overwrite the old fields.  The new fields should remain intact.
    oldVersion.setOld1(345);
    oldVersion.setOld2("garply");
    sub.setOld1(678);
    sub.setOld2("waldo");
  }

  // Set two new strings.
  size_t size6 = builder.getSegmentsForOutput().size();
  EXPECT_EQ(size5 + 2, size6);

  {
    // Back to the new version again.
    auto newVersion = root.getAnyPointerField().getAs<test::TestNewVersion>();
    EXPECT_EQ(345, newVersion.getOld1());
    EXPECT_EQ("garply", newVersion.getOld2());
    EXPECT_EQ(321, newVersion.getNew1());
    EXPECT_EQ("quux", newVersion.getNew2());

    auto sub = newVersion.getOld3();
    EXPECT_EQ(678, sub.getOld1());
    EXPECT_EQ("waldo", sub.getOld2());
    EXPECT_EQ(654, sub.getNew1());
    EXPECT_EQ("grault", sub.getNew2());
  }

  // Size should not have changed because we didn't write anything and the structs were already
  // the right size.
  EXPECT_EQ(size6, builder.getSegmentsForOutput().size());
}